

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::
ConstructorsAndUnsizedDeclUnsizedArrays1<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ConstructorsAndUnsizedDeclUnsizedArrays1<glcts::ArraysOfArrays::Interface::GL> *this,
          TestShaderType tested_shader_type)

{
  TestError *this_00;
  undefined1 local_e0 [8];
  string shader_source;
  string local_b8 [55];
  allocator<char> local_81;
  string local_80 [32];
  string local_60 [32];
  ulong local_40;
  size_t max_dimension_index;
  string base_variable_string;
  TestShaderType tested_shader_type_local;
  ConstructorsAndUnsizedDeclUnsizedArrays1<glcts::ArraysOfArrays::Interface::GL> *this_local;
  
  base_variable_string.field_2._12_4_ = tested_shader_type;
  std::__cxx11::string::string((string *)&max_dimension_index);
  for (local_40 = 2; local_40 < 9; local_40 = local_40 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_80,"    int x",&local_81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_b8,"[]",(allocator<char> *)(shader_source.field_2._M_local_buf + 0xf));
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[6])(local_60,this,local_80,local_b8,local_40);
    std::__cxx11::string::operator=((string *)&max_dimension_index,local_60);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)(shader_source.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator(&local_81);
    std::__cxx11::string::operator+=((string *)&max_dimension_index,";\n\n");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   shader_start_abi_cxx11_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &max_dimension_index);
    switch(base_variable_string.field_2._12_4_) {
    case 0:
      break;
    case 1:
      std::__cxx11::string::operator+=((string *)local_e0,"\n\tgl_Position = vec4(0.0);\n");
      break;
    case 2:
      break;
    case 3:
      std::__cxx11::string::operator+=((string *)local_e0,(string *)emit_quad_abi_cxx11_);
      break;
    case 4:
      std::__cxx11::string::operator+=((string *)local_e0,(string *)set_tesseation_abi_cxx11_);
      break;
    case 5:
      break;
    default:
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0xa1c);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator+=((string *)local_e0,(string *)shader_end_abi_cxx11_);
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.super_TestNode
      ._vptr_TestNode[8])(this,(ulong)(uint)base_variable_string.field_2._12_4_,local_e0);
    std::__cxx11::string::~string((string *)local_e0);
  }
  std::__cxx11::string::~string((string *)&max_dimension_index);
  return;
}

Assistant:

void ConstructorsAndUnsizedDeclUnsizedArrays1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string base_variable_string;

	for (size_t max_dimension_index = 2; max_dimension_index <= API::MAX_ARRAY_DIMENSIONS; max_dimension_index++)
	{
		base_variable_string = this->extend_string("    int x", "[]", max_dimension_index);
		base_variable_string += ";\n\n";

		std::string shader_source = shader_start + base_variable_string;

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		this->execute_negative_test(tested_shader_type, shader_source);
	} /* for (int max_dimension_index = 2; ...) */
}